

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# icrs2cirs.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  CEObserver *this;
  CEDate *this_00;
  double dVar2;
  CESkyCoord cirs_coords;
  CESkyCoord icrs_coords;
  CEExecOptions opts;
  CEExecOptions *in_stack_fffffffffffffb40;
  CLOptions *in_stack_fffffffffffffb48;
  CLOptions *this_01;
  CESkyCoordType *in_stack_fffffffffffffb58;
  allocator *date;
  CEObserver *observer;
  CESkyCoord *this_02;
  undefined1 local_471 [216];
  allocator local_399;
  string local_398 [144];
  undefined4 local_308;
  undefined1 local_301 [33];
  CEDate *local_2e0;
  undefined1 local_2c1 [33];
  CEObserver *local_2a0;
  undefined4 local_258;
  double in_stack_fffffffffffffe10;
  CESkyCoord *in_stack_fffffffffffffe18;
  CESkyCoord *in_stack_fffffffffffffe20;
  char **in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe44;
  CLOptions *in_stack_fffffffffffffe48;
  
  DefineOpts();
  bVar1 = CLOptions::ParseCommandLine
                    (in_stack_fffffffffffffe48,in_stack_fffffffffffffe44,in_stack_fffffffffffffe38);
  if (bVar1) {
    local_258 = 1;
  }
  else {
    this_02 = (CESkyCoord *)local_2c1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_2c1 + 1),"ra",(allocator *)this_02);
    this = (CEObserver *)
           CLOptions::AsDouble(in_stack_fffffffffffffb48,(string *)in_stack_fffffffffffffb40);
    local_2a0 = this;
    CEAngle::Deg((double *)this_02);
    observer = (CEObserver *)local_301;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_301 + 1),"dec",(allocator *)observer);
    this_00 = (CEDate *)
              CLOptions::AsDouble(in_stack_fffffffffffffb48,(string *)in_stack_fffffffffffffb40);
    local_2e0 = this_00;
    CEAngle::Deg((double *)this_02);
    local_308 = 1;
    CESkyCoord::CESkyCoord
              ((CESkyCoord *)this,(CEAngle *)observer,(CEAngle *)this_00,in_stack_fffffffffffffb58);
    CEAngle::~CEAngle((CEAngle *)0x13770f);
    std::__cxx11::string::~string((string *)(local_301 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_301);
    CEAngle::~CEAngle((CEAngle *)0x137736);
    std::__cxx11::string::~string((string *)(local_2c1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_2c1);
    date = &local_399;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_398,"juliandate",date);
    dVar2 = CLOptions::AsDouble(in_stack_fffffffffffffb48,(string *)in_stack_fffffffffffffb40);
    CEDate::CEDate(this_00,(double)date,(CEDateType)((ulong)dVar2 >> 0x20));
    CEObserver::CEObserver(this);
    CESkyCoord::ConvertToCIRS(this_02,(CEDate *)this,observer);
    CEObserver::~CEObserver((CEObserver *)in_stack_fffffffffffffb40);
    CEDate::~CEDate((CEDate *)0x1377f8);
    std::__cxx11::string::~string(local_398);
    std::allocator<char>::~allocator((allocator<char> *)&local_399);
    this_01 = (CLOptions *)local_471;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_471 + 1),"juliandate",(allocator *)this_01);
    in_stack_fffffffffffffb40 =
         (CEExecOptions *)CLOptions::AsDouble(this_01,(string *)in_stack_fffffffffffffb40);
    PrintResults(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
    std::__cxx11::string::~string((string *)(local_471 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_471);
    local_258 = 1;
    CESkyCoord::~CESkyCoord((CESkyCoord *)in_stack_fffffffffffffb40);
    CESkyCoord::~CESkyCoord((CESkyCoord *)in_stack_fffffffffffffb40);
  }
  CEExecOptions::~CEExecOptions(in_stack_fffffffffffffb40);
  return 0;
}

Assistant:

int main (int argc, char** argv)
{
    // Get the options from the command line
    CEExecOptions opts = DefineOpts();
    if (opts.ParseCommandLine(argc, argv)) return 0;
    
    // Create a CESkyCoord object
    CESkyCoord icrs_coords(CEAngle::Deg(opts.AsDouble("ra")), 
                           CEAngle::Deg(opts.AsDouble("dec")),
                           CESkyCoordType::ICRS);
    
    // Get the coordinates as CIRS
    CESkyCoord cirs_coords = icrs_coords.ConvertToCIRS(opts.AsDouble("juliandate"));
    
    // Print the result
    PrintResults(icrs_coords, cirs_coords, opts.AsDouble("juliandate")) ;

    return 0;
}